

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O2

void __thiscall
Diligent::ShaderVariableManagerGL::TextureBindInfo::BindResource
          (TextureBindInfo *this,BindResourceInfo *BindInfo)

{
  SHADER_RESOURCE_TYPE ResourceType;
  ShaderResourceCacheGL *this_00;
  Uint32 UVar1;
  PipelineResourceDesc *ResDesc;
  ResourceAttribs *Res;
  CachedResourceView *pCVar2;
  char (*in_R8) [41];
  initializer_list<Diligent::BUFFER_VIEW_TYPE> ExpectedViewTypes;
  RefCntAutoPtr<Diligent::TextureViewGLImpl> pViewGL;
  string msg;
  
  ResDesc = ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
            ::GetDesc((ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                       *)this);
  Res = GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>::GetAttribs
                  (&this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>);
  if (ResDesc->ArraySize <= BindInfo->ArrayIndex) {
    FormatString<char[89]>
              (&msg,(char (*) [89])
                    "Index is out of range, but it should\'ve been corrected by ShaderVariableBase::SetArray()"
              );
    DebugAssertionFailed
              ((Char *)CONCAT71(msg._M_dataplus._M_p._1_7_,msg._M_dataplus._M_p._0_1_),
               "BindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0xe8);
    std::__cxx11::string::~string((string *)&msg);
  }
  this_00 = (((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>).
              super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
             .m_ParentManager)->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>)
            .m_ResourceCache;
  ResourceType = ResDesc->ResourceType;
  if (ResourceType != SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT) {
    if (ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV) {
      RefCntAutoPtr<Diligent::BufferViewGLImpl>::RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&pViewGL,
                 &BindInfo->pObject->super_IObject,(INTERFACE_ID *)IID_BufferViewGL);
      pCVar2 = ShaderResourceCacheGL::GetConstTexture
                         (this_00,BindInfo->ArrayIndex + Res->CacheOffset);
      msg._M_dataplus._M_p._0_1_ = 1;
      ExpectedViewTypes._M_len = 1;
      ExpectedViewTypes._M_array = (iterator)0x1;
      VerifyResourceViewBinding<Diligent::BufferViewGLImpl,Diligent::BUFFER_VIEW_TYPE>
                ((Diligent *)ResDesc,(PipelineResourceDesc *)BindInfo,
                 (BindResourceInfo *)pViewGL.m_pObject,(BufferViewGLImpl *)&msg,ExpectedViewTypes,
                 RESOURCE_DIM_UNDEFINED,SUB81((pCVar2->pView).m_pObject,0),
                 (IDeviceObject *)
                 (((((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>
                     ).
                     super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                    .m_ParentManager)->
                   super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).m_pSignature
                  )->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
                 super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                 .m_Desc.super_DeviceObjectAttribs.Name,(char *)pViewGL.m_pObject);
      if ((ResDesc->Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) == PIPELINE_RESOURCE_FLAG_NONE)
      {
        FormatString<char[92]>
                  (&msg,(char (*) [92])
                        "FORMATTED_BUFFER resource flag is not set for a texel buffer - this should\'ve not happened."
                  );
        DebugAssertionFailed
                  ((Char *)CONCAT71(msg._M_dataplus._M_p._1_7_,msg._M_dataplus._M_p._0_1_),
                   "BindResource",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                   ,0x116);
        std::__cxx11::string::~string((string *)&msg);
      }
      ValidateBufferMode<Diligent::BufferViewGLImpl>
                (ResDesc,BindInfo->ArrayIndex,(BufferViewGLImpl *)pViewGL.m_pObject);
      ShaderResourceCacheGL::SetTexelBuffer
                (this_00,BindInfo->ArrayIndex + Res->CacheOffset,
                 (RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&pViewGL);
      RefCntAutoPtr<Diligent::BufferViewGLImpl>::Release
                ((RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&pViewGL);
      return;
    }
    if (ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_SRV) {
      pViewGL.m_pObject = (TextureViewGLImpl *)GetShaderResourceTypeLiteralName(ResourceType,false);
      FormatString<char[26],char_const*,char[41]>
                (&msg,(Diligent *)"Unexpected resource type ",(char (*) [26])&pViewGL,
                 (char **)". Texture SRV or buffer SRV is expected.",in_R8);
      DebugAssertionFailed
                ((Char *)CONCAT71(msg._M_dataplus._M_p._1_7_,msg._M_dataplus._M_p._0_1_),
                 "BindResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                 ,0x11e);
      std::__cxx11::string::~string((string *)&msg);
      return;
    }
  }
  RefCntAutoPtr<Diligent::TextureViewGLImpl>::RefCntAutoPtr
            (&pViewGL,&BindInfo->pObject->super_IObject,(INTERFACE_ID *)IID_TextureViewGL);
  UVar1 = PipelineResourceSignatureGLImpl::GetImmutableSamplerIdx
                    ((((this->
                       super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>).
                       super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                      .m_ParentManager)->
                     super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
                     m_pSignature,Res);
  pCVar2 = ShaderResourceCacheGL::GetConstTexture(this_00,BindInfo->ArrayIndex + Res->CacheOffset);
  msg._M_dataplus._M_p._0_1_ = 1;
  VerifyResourceViewBinding<Diligent::TextureViewGLImpl,Diligent::TEXTURE_VIEW_TYPE>
            ((Diligent *)ResDesc,(PipelineResourceDesc *)BindInfo,
             (BindResourceInfo *)pViewGL.m_pObject,(TextureViewGLImpl *)&msg,
             (initializer_list<Diligent::TEXTURE_VIEW_TYPE>)ZEXT816(1),RESOURCE_DIM_UNDEFINED,
             SUB81((pCVar2->pView).m_pObject,0),
             (IDeviceObject *)
             (((((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>).
                 super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                .m_ParentManager)->
               super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).m_pSignature)->
             super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
             .m_Desc.super_DeviceObjectAttribs.Name,(char *)pViewGL.m_pObject);
  if (UVar1 != 0xffffffff) {
    if ((this_00->m_ContentType == SRB) && ((pCVar2->field_2).pBuffer == (BufferGLImpl *)0x0)) {
      FormatString<char[114]>
                (&msg,(char (*) [114])
                      "Immutable samplers must be initialized in the SRB cache by PipelineResourceSignatureGLImpl::InitSRBResourceCache!"
                );
      DebugAssertionFailed
                ((Char *)CONCAT71(msg._M_dataplus._M_p._1_7_,msg._M_dataplus._M_p._0_1_),
                 "BindResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                 ,0xfd);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((UVar1 != 0xffffffff) && (ResDesc->ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT)) {
      FormatString<char[49]>(&msg,(char (*) [49])"Input attachment must not have assigned sampler.")
      ;
      DebugAssertionFailed
                ((Char *)CONCAT71(msg._M_dataplus._M_p._1_7_,msg._M_dataplus._M_p._0_1_),
                 "BindResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                 ,0x101);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  ShaderResourceCacheGL::SetTexture
            (this_00,BindInfo->ArrayIndex + Res->CacheOffset,&pViewGL,UVar1 == 0xffffffff);
  RefCntAutoPtr<Diligent::TextureViewGLImpl>::Release(&pViewGL);
  return;
}

Assistant:

void ShaderVariableManagerGL::TextureBindInfo::BindResource(const BindResourceInfo& BindInfo)
{
    const auto& Desc = GetDesc();
    const auto& Attr = GetAttribs();

    VERIFY(BindInfo.ArrayIndex < Desc.ArraySize, "Index is out of range, but it should've been corrected by ShaderVariableBase::SetArray()");
    auto& ResourceCache = m_ParentManager.m_ResourceCache;

    if (Desc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV ||
        Desc.ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT)
    {
        // We cannot use ClassPtrCast<> here as the resource can be of wrong type
        RefCntAutoPtr<TextureViewGLImpl> pViewGL{BindInfo.pObject, IID_TextureViewGL};

        const auto ImmutableSamplerAssigned = (m_ParentManager.m_pSignature->GetImmutableSamplerIdx(Attr) != InvalidImmutableSamplerIndex);
#ifdef DILIGENT_DEVELOPMENT
        {
            const auto& CachedTexSampler = ResourceCache.GetConstTexture(Attr.CacheOffset + BindInfo.ArrayIndex);
            VerifyResourceViewBinding(Desc, BindInfo, pViewGL.RawPtr(),
                                      {TEXTURE_VIEW_SHADER_RESOURCE}, // Expected view type
                                      RESOURCE_DIM_UNDEFINED,         // Expected resource dimension - unknown at this point
                                      false,                          // IsMultisample (ignored when resource dim is undefined)
                                      CachedTexSampler.pView.RawPtr(),
                                      m_ParentManager.m_pSignature->GetDesc().Name);
            if (ImmutableSamplerAssigned && ResourceCache.GetContentType() == ResourceCacheContentType::SRB)
            {
                VERIFY(CachedTexSampler.pSampler != nullptr, "Immutable samplers must be initialized in the SRB cache by PipelineResourceSignatureGLImpl::InitSRBResourceCache!");
            }
            if (Desc.ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT)
            {
                DEV_CHECK_ERR(!ImmutableSamplerAssigned, "Input attachment must not have assigned sampler.");
            }
        }
#endif
        ResourceCache.SetTexture(Attr.CacheOffset + BindInfo.ArrayIndex, std::move(pViewGL), !ImmutableSamplerAssigned);
    }
    else if (Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV)
    {
        // We cannot use ClassPtrCast<> here as the resource can be of wrong type
        RefCntAutoPtr<BufferViewGLImpl> pViewGL{BindInfo.pObject, IID_BufferViewGL};
#ifdef DILIGENT_DEVELOPMENT
        {
            const auto& CachedBuffSampler = ResourceCache.GetConstTexture(Attr.CacheOffset + BindInfo.ArrayIndex);
            VerifyResourceViewBinding(Desc, BindInfo, pViewGL.RawPtr(),
                                      {BUFFER_VIEW_SHADER_RESOURCE}, // Expected view type
                                      RESOURCE_DIM_BUFFER,           // Expected resource dimension
                                      false,                         // IsMultisample (ignored when resource dim is buffer)
                                      CachedBuffSampler.pView.RawPtr(),
                                      m_ParentManager.m_pSignature->GetDesc().Name);

            VERIFY((Desc.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) != 0,
                   "FORMATTED_BUFFER resource flag is not set for a texel buffer - this should've not happened.");
            ValidateBufferMode(Desc, BindInfo.ArrayIndex, pViewGL.RawPtr());
        }
#endif
        ResourceCache.SetTexelBuffer(Attr.CacheOffset + BindInfo.ArrayIndex, std::move(pViewGL));
    }
    else
    {
        UNEXPECTED("Unexpected resource type ", GetShaderResourceTypeLiteralName(Desc.ResourceType), ". Texture SRV or buffer SRV is expected.");
    }
}